

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.hh
# Opt level: O2

void __thiscall avro::Name::Name(Name *this,string *simpleName,string *ns)

{
  std::__cxx11::string::string((string *)this,(string *)ns);
  std::__cxx11::string::string((string *)&this->simpleName_,(string *)simpleName);
  check(this);
  return;
}

Assistant:

Name(const std::string& simpleName, const std::string& ns) : ns_(ns), simpleName_(simpleName) { check(); }